

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_info.cpp
# Opt level: O0

string * __thiscall
license::os::CPUVendorID::toString_abi_cxx11_(string *__return_storage_ptr__,CPUVendorID *this)

{
  allocator local_19;
  CPUVendorID *local_18;
  CPUVendorID *this_local;
  
  local_18 = this;
  this_local = (CPUVendorID *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,0xc,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

string toString() const { return string(reinterpret_cast<const char *>(this), 12); }